

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void Centaurus::DFARoutineEM64T<wchar_t>::emit_state
               (X86Assembler *as,Label *rejectlabel,DFAState<wchar_t> *state,int index,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels,MyConstPool *pool)

{
  bool bVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *__x;
  pointer pNVar5;
  size_type sVar6;
  CharClass<wchar_t> *pCVar7;
  reference this;
  reference this_00;
  X86Assembler *in_stack_fffffffffffffa08;
  uint32_t instId;
  CodeEmitter *in_stack_fffffffffffffa10;
  uint32_t in_stack_fffffffffffffa1c;
  CodeEmitter *in_stack_fffffffffffffa20;
  CodeEmitter *this_01;
  wchar_t in_stack_fffffffffffffa2c;
  X86Assembler *in_stack_fffffffffffffa30;
  wchar_t in_stack_fffffffffffffa3c;
  CodeEmitter *in_stack_fffffffffffffa40;
  Range<wchar_t> *r_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  CharClass<wchar_t> *__range3;
  NFATransition<wchar_t> *tr_1;
  iterator __end0;
  iterator __begin0;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *__range2;
  Range<wchar_t> *local_488;
  Range<wchar_t> *r;
  NFATransition<wchar_t> *tr;
  undefined4 local_470;
  undefined4 local_46c;
  undefined4 local_464;
  NFATransition<wchar_t> *local_460;
  const_iterator local_458;
  NFATransition<wchar_t> *local_450;
  Imm local_448;
  undefined8 local_438;
  undefined4 local_430;
  undefined4 local_42c;
  undefined1 local_428 [8];
  Label looplabel;
  __normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
  local_3f8;
  __normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
  local_3f0;
  iterator i;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  transitions;
  MyConstPool *pool_local;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels_local;
  int index_local;
  DFAState<wchar_t> *state_local;
  Label *rejectlabel_local;
  X86Assembler *as_local;
  uint32_t signature;
  uint32_t signature_1;
  
  __x = NFABaseState<wchar_t,_Centaurus::IndexVector>::get_transitions
                  (&state->super_NFABaseState<wchar_t,_Centaurus::IndexVector>);
  std::
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>::
  vector((vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
          *)&i,__x);
  local_3f0._M_current =
       (NFATransition<wchar_t> *)
       std::
       vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
       ::begin((vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                *)&i);
  while( true ) {
    local_3f8._M_current =
         (NFATransition<wchar_t> *)
         std::
         vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
         ::end((vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                *)&i);
    bVar1 = __gnu_cxx::operator!=(&local_3f0,&local_3f8);
    if (!bVar1) break;
    pNVar5 = __gnu_cxx::
             __normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
             ::operator->(&local_3f0);
    iVar2 = NFATransition<wchar_t>::dest(pNVar5);
    if ((iVar2 == index) && (bVar1 = DFAState<wchar_t>::is_long(state), bVar1)) {
      looplabel.super_Operand.super_Operand_.field_0._mem.field_2 =
           (anon_union_8_2_78723da6_for_MemData_2)0x210000149;
      pNVar5 = __gnu_cxx::
               __normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
               ::operator->(&local_3f0);
      pCVar7 = NFATransition<wchar_t>::label(pNVar5);
      MyConstPool::load_charclass_filter<wchar_t>
                (pool,(X86Xmm *)((long)&looplabel.super_Operand.super_Operand_.field_0 + 8),pCVar7);
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(local_428);
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,local_428);
      local_438 = 0x32;
      local_42c = 6;
      local_430 = 0;
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                 (Operand_ *)in_stack_fffffffffffffa10,(Operand_ *)in_stack_fffffffffffffa08);
      asmjit::Imm::Imm(&local_448,0x15);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                 (Operand_ *)in_stack_fffffffffffffa10,(Operand_ *)in_stack_fffffffffffffa08,
                 (Operand_ *)0x17edf6);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                 (Operand_ *)in_stack_fffffffffffffa10,(Operand_ *)in_stack_fffffffffffffa08);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                 (Operand_ *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffffa10,(uint32_t)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                 (Operand_ *)0x17eed8);
      __gnu_cxx::
      __normal_iterator<Centaurus::NFATransition<wchar_t>const*,std::vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>>
      ::__normal_iterator<Centaurus::NFATransition<wchar_t>*>
                ((__normal_iterator<Centaurus::NFATransition<wchar_t>const*,std::vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>>
                  *)&local_458,&local_3f0);
      local_450 = (NFATransition<wchar_t> *)
                  std::
                  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                  ::erase((vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                           *)&i,local_458);
      local_3f0._M_current = local_450;
    }
    else {
      local_460 = (NFATransition<wchar_t> *)
                  __gnu_cxx::
                  __normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                  ::operator++(&local_3f0,0);
    }
  }
  bVar1 = DFAState<wchar_t>::is_accept_state(state);
  if (bVar1) {
    asmjit::CodeEmitter::emit
              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
               (Operand_ *)in_stack_fffffffffffffa10,(Operand_ *)in_stack_fffffffffffffa08);
  }
  bVar1 = std::
          vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
          ::empty((vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                   *)&i);
  if (bVar1) {
    asmjit::CodeEmitter::emit
              (in_stack_fffffffffffffa10,(uint32_t)((ulong)in_stack_fffffffffffffa08 >> 0x20),
               (Operand_ *)0x17f018);
    local_464 = 1;
  }
  else {
    tr = (NFATransition<wchar_t> *)0x2000032;
    local_46c = 6;
    local_470 = 0;
    asmjit::CodeEmitter::emit
              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
               (Operand_ *)in_stack_fffffffffffffa10,(Operand_ *)in_stack_fffffffffffffa08);
    asmjit::CodeEmitter::emit
              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
               (Operand_ *)in_stack_fffffffffffffa10,(Operand_ *)in_stack_fffffffffffffa08);
    asmjit::CodeEmitter::emit
              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
               (Operand_ *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
    sVar6 = std::
            vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
            ::size((vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                    *)&i);
    if (sVar6 == 1) {
      r = (Range<wchar_t> *)
          std::
          vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
          ::operator[]((vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                        *)&i,0);
      pCVar7 = NFATransition<wchar_t>::label((NFATransition<wchar_t> *)r);
      iVar2 = CharClass<wchar_t>::size(pCVar7);
      instId = (uint32_t)((ulong)in_stack_fffffffffffffa08 >> 0x20);
      if (iVar2 == 1) {
        pCVar7 = NFATransition<wchar_t>::label((NFATransition<wchar_t> *)r);
        CharClass<wchar_t>::operator[]((CharClass<wchar_t> *)&__range2,(int)pCVar7);
        local_488 = (Range<wchar_t> *)&__range2;
        wVar3 = Range<wchar_t>::start(local_488);
        wVar4 = Range<wchar_t>::end(local_488);
        if (wVar3 + L'\x01' == wVar4) {
          Range<wchar_t>::start(local_488);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                     (Operand_ *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
          asmjit::CodeEmitter::emit(in_stack_fffffffffffffa10,instId,(Operand_ *)0x17f44f);
        }
        else {
          Range<wchar_t>::start(local_488);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                     (Operand_ *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
          Range<wchar_t>::end(local_488);
          Range<wchar_t>::start(local_488);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                     (Operand_ *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
          asmjit::CodeEmitter::emit(in_stack_fffffffffffffa10,instId,(Operand_ *)0x17f5bd);
        }
        iVar2 = NFATransition<wchar_t>::dest((NFATransition<wchar_t> *)r);
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[](labels,(long)iVar2);
        asmjit::CodeEmitter::emit(in_stack_fffffffffffffa10,instId,(Operand_ *)0x17f635);
        local_464 = 1;
        Range<wchar_t>::~Range((Range<wchar_t> *)&__range2);
        goto LAB_0017fad3;
      }
    }
    __end0 = std::
             vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
             ::begin((vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                      *)&i);
    tr_1 = (NFATransition<wchar_t> *)
           std::
           vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ::end((vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                  *)&i);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                                       *)&tr_1), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
             ::operator*(&__end0);
      pCVar7 = NFATransition<wchar_t>::label(this);
      __end0_1 = CharClass<wchar_t>::begin(pCVar7);
      r_1 = (Range<wchar_t> *)CharClass<wchar_t>::end(pCVar7);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end0_1,
                                (__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                                 *)&r_1), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                  ::operator*(&__end0_1);
        wVar3 = Range<wchar_t>::start(this_00);
        wVar4 = Range<wchar_t>::end(this_00);
        if (wVar3 + L'\x01' == wVar4) {
          Range<wchar_t>::start(this_00);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                     (Operand_ *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
          in_stack_fffffffffffffa40 = (CodeEmitter *)as;
          iVar2 = NFATransition<wchar_t>::dest(this);
          std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[](labels,(long)iVar2)
          ;
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa10,(uint32_t)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                     (Operand_ *)0x17f886);
        }
        else {
          in_stack_fffffffffffffa30 = as;
          in_stack_fffffffffffffa3c = Range<wchar_t>::start(this_00);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                     (Operand_ *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
          this_01 = (CodeEmitter *)as;
          in_stack_fffffffffffffa2c = Range<wchar_t>::end(this_00);
          wVar3 = Range<wchar_t>::start(this_00);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                     (Operand_ *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
          in_stack_fffffffffffffa08 = as;
          in_stack_fffffffffffffa10 = (CodeEmitter *)labels;
          iVar2 = NFATransition<wchar_t>::dest(this);
          std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                    ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)
                     in_stack_fffffffffffffa10,(long)iVar2);
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffa10,(uint32_t)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                     (Operand_ *)0x17fa0f);
          asmjit::CodeEmitter::emit
                    (this_01,wVar3,(Operand_ *)in_stack_fffffffffffffa10,
                     (Operand_ *)in_stack_fffffffffffffa08);
        }
        __gnu_cxx::
        __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
        ::operator++(&__end0_1);
      }
      __gnu_cxx::
      __normal_iterator<Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
      ::operator++(&__end0);
    }
    asmjit::CodeEmitter::emit
              (in_stack_fffffffffffffa10,(uint32_t)((ulong)in_stack_fffffffffffffa08 >> 0x20),
               (Operand_ *)0x17fac5);
    local_464 = 0;
  }
LAB_0017fad3:
  std::
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>::
  ~vector((vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           *)&i);
  return;
}

Assistant:

void DFARoutineEM64T<TCHAR>::emit_state(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const DFAState<TCHAR>& state, int index, std::vector<asmjit::Label>& labels, MyConstPool& pool)
{
    std::vector<NFATransition<TCHAR> > transitions(state.get_transitions());

    for (auto i = transitions.begin(); i != transitions.end();)
    {
        if (i->dest() == index && state.is_long())
        {
            pool.load_charclass_filter(PATTERN2_REG, i->label());

            asmjit::Label looplabel = as.newLabel();

            as.bind(looplabel);

            as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
            as.pcmpistri(PATTERN2_REG, LOAD_REG, asmjit::Imm(sizeof(TCHAR) == 1 ? 0x14 : 0x15));
            if (sizeof(TCHAR) == 2)
                as.sal(INDEX_REG, 1);
            as.add(INPUT_REG, INDEX_REG);
            as.cmp(INDEX_REG, 15);
            as.jg(looplabel);
            i = transitions.erase(i);
        }
        else
        {
            i++;
        }
    }

    if (state.is_accept_state())
        as.mov(BACKUP_REG, INPUT_REG);

    if (transitions.empty())
    {
        as.jmp(rejectlabel);
        return;
    }

    //Read the character from stream and advance the input position
    if (sizeof(TCHAR) == 1)
        as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
    else
        as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
    as.mov(CHAR2_REG, CHAR_REG);
    if (sizeof(TCHAR) == 1)
        as.inc(INPUT_REG);
    else
        as.add(INPUT_REG, 2);

    if (transitions.size() == 1)
    {
        const NFATransition<TCHAR>& tr = transitions[0];

        if (tr.label().size() == 1)
        {
            const Range<TCHAR>& r = tr.label()[0];
            {
                if (r.start() + 1 == r.end())
                {
                    as.cmp(CHAR_REG, r.start());
                    as.jne(rejectlabel);
                }
                else
                {
                    as.sub(CHAR_REG, r.start());
                    as.cmp(CHAR_REG, r.end() - r.start());
                    as.jnb(rejectlabel);
                }
            }
            as.jmp(labels[tr.dest()]);

            return;
        }
    }
    for (const auto& tr : transitions)
    {
        for (const auto& r : tr.label())
        {
            if (r.start() + 1 == r.end())
            {
                //The range consists of one character: test for equality and jump
                as.cmp(CHAR_REG, r.start());
                as.je(labels[tr.dest()]);
            }
            else
            {
                //The range consists of multiple characters: range check and jump
                as.sub(CHAR_REG, r.start());
                as.cmp(CHAR_REG, r.end() - r.start());
                as.jb(labels[tr.dest()]);
                as.mov(CHAR_REG, CHAR2_REG);
            }
        }
    }
    //Jump to the "reject trampoline" and check if the input has ever been accepted
    as.jmp(rejectlabel);
}